

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDLImporter::CalculateUVCoordinates_MDL5(MDLImporter *this)

{
  aiTexture *paVar1;
  aiMesh *paVar2;
  aiTexel aVar3;
  Logger *this_00;
  long lVar4;
  aiTexel aVar5;
  ulong uVar6;
  
  if ((*(int *)(this->mBuffer + 0x30) != 0) && (this->pScene->mNumTextures != 0)) {
    paVar1 = *this->pScene->mTextures;
    aVar3 = (aiTexel)paVar1->mHeight;
    if (aVar3 == (aiTexel)0x0) {
      aVar3 = paVar1->pcData[3];
      aVar5 = paVar1->pcData[4];
      if (aVar3 == (aiTexel)0x0 || aVar5 == (aiTexel)0x0) {
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,
                     "Either the width or the height of the embedded DDS texture is zero. Unable to compute final texture coordinates. The texture coordinates remain in their original 0-x/0-y (x,y = texture size) range."
                    );
        aVar3.b = '\x01';
        aVar3.g = '\0';
        aVar3.r = '\0';
        aVar3.a = '\0';
        aVar5.b = '\x01';
        aVar5.g = '\0';
        aVar5.r = '\0';
        aVar5.a = '\0';
      }
    }
    else {
      aVar5 = (aiTexel)paVar1->mWidth;
    }
    if (((aVar3 != (aiTexel)0x1) || (aVar5 != (aiTexel)0x1)) &&
       (paVar2 = *this->pScene->mMeshes, paVar2->mNumVertices != 0)) {
      lVar4 = 0;
      uVar6 = 0;
      do {
        *(float *)((long)&paVar2->mTextureCoords[0]->x + lVar4) =
             *(float *)((long)&paVar2->mTextureCoords[0]->x + lVar4) / (float)(uint)aVar5;
        *(float *)((long)&paVar2->mTextureCoords[0]->y + lVar4) =
             *(float *)((long)&paVar2->mTextureCoords[0]->y + lVar4) / (float)(uint)aVar3;
        *(float *)((long)&paVar2->mTextureCoords[0]->y + lVar4) =
             1.0 - *(float *)((long)&paVar2->mTextureCoords[0]->y + lVar4);
        uVar6 = uVar6 + 1;
        lVar4 = lVar4 + 0xc;
      } while (uVar6 < paVar2->mNumVertices);
    }
  }
  return;
}

Assistant:

void MDLImporter::CalculateUVCoordinates_MDL5()
{
    const MDL::Header* const pcHeader = (const MDL::Header*)this->mBuffer;
    if (pcHeader->num_skins && this->pScene->mNumTextures)  {
        const aiTexture* pcTex = this->pScene->mTextures[0];

        // if the file is loaded in DDS format: get the size of the
        // texture from the header of the DDS file
        // skip three DWORDs and read first height, then the width
        unsigned int iWidth, iHeight;
        if (!pcTex->mHeight)    {
            const uint32_t* piPtr = (uint32_t*)pcTex->pcData;

            piPtr += 3;
            iHeight = (unsigned int)*piPtr++;
            iWidth  = (unsigned int)*piPtr;
            if (!iHeight || !iWidth)
            {
                ASSIMP_LOG_WARN("Either the width or the height of the "
                    "embedded DDS texture is zero. Unable to compute final texture "
                    "coordinates. The texture coordinates remain in their original "
                    "0-x/0-y (x,y = texture size) range.");
                iWidth  = 1;
                iHeight = 1;
            }
        }
        else    {
            iWidth  = pcTex->mWidth;
            iHeight = pcTex->mHeight;
        }

        if (1 != iWidth || 1 != iHeight)    {
            const float fWidth = (float)iWidth;
            const float fHeight = (float)iHeight;
            aiMesh* pcMesh = this->pScene->mMeshes[0];
            for (unsigned int i = 0; i < pcMesh->mNumVertices;++i)
            {
                pcMesh->mTextureCoords[0][i].x /= fWidth;
                pcMesh->mTextureCoords[0][i].y /= fHeight;
                pcMesh->mTextureCoords[0][i].y = 1.0f - pcMesh->mTextureCoords[0][i].y; // DX to OGL
            }
        }
    }
}